

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.hpp
# Opt level: O0

uint64_t __thiscall tcmalloc::Span::InitFreeList(Span *this,uint64_t obj_bytes)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  uint64_t limit;
  uint64_t ptr;
  uint64_t obj_bytes_local;
  Span *this_local;
  
  if (this->location != 0) {
    __assert_fail("location == IN_USE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/span.hpp"
                  ,0x42,"uint64_t tcmalloc::Span::InitFreeList(uint64_t)");
  }
  FreeList::Clear(&this->freelist);
  bVar1 = FreeList::Empty(&this->freelist);
  if (!bVar1) {
    __assert_fail("freelist.Empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/span.hpp"
                  ,0x44,"uint64_t tcmalloc::Span::InitFreeList(uint64_t)");
  }
  limit = this->page_id * 0x2000;
  uVar3 = limit + this->npages * 0x2000;
  for (; limit + obj_bytes <= uVar3; limit = obj_bytes + limit) {
    FreeList::PushFront(&this->freelist,(void *)limit);
  }
  iVar2 = FreeList::FreeObjects(&this->freelist);
  return (long)iVar2;
}

Assistant:

uint64_t InitFreeList(uint64_t obj_bytes) {
        assert(location == IN_USE);
        freelist.Clear();
        assert(freelist.Empty());
        uint64_t ptr = reinterpret_cast<uint64_t>(reinterpret_cast<char *>(page_id * spanPageSize));
        uint64_t limit = ptr + (npages * spanPageSize);
        while (ptr + obj_bytes <= limit) {
            freelist.PushFront((void*)ptr);
            ptr += obj_bytes;
        }
        return freelist.FreeObjects();
    }